

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.h
# Opt level: O0

void __thiscall
lzham::quasi_adaptive_huffman_data_model::set_malloc_context
          (quasi_adaptive_huffman_data_model *this,lzham_malloc_context malloc_context)

{
  vector<unsigned_char> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  vector<unsigned_short>::set_malloc_context((vector<unsigned_short> *)in_RSI,in_RDI);
  vector<unsigned_short>::set_malloc_context((vector<unsigned_short> *)in_RSI,in_RDI);
  vector<unsigned_short>::set_malloc_context((vector<unsigned_short> *)in_RSI,in_RDI);
  vector<unsigned_char>::set_malloc_context(in_RSI,in_RDI);
  return;
}

Assistant:

void set_malloc_context(lzham_malloc_context malloc_context) 
      { 
         m_malloc_context = malloc_context; 
         m_initial_sym_freq.set_malloc_context(malloc_context);
         m_sym_freq.set_malloc_context(malloc_context);
         m_codes.set_malloc_context(malloc_context);
         m_code_sizes.set_malloc_context(malloc_context);
      }